

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O0

void decode_nvrm_ioctl_create(nvrm_ioctl_create *s,mmt_memory_dump *args,int argc)

{
  bool bVar1;
  FILE *__stream;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  int local_5c;
  int k;
  nvrm_create_arg_decoder *dec;
  _func_void_nvrm_ioctl_create_ptr_void_ptr *fun;
  int found;
  mmt_buf *local_38;
  mmt_buf *__ret;
  mmt_buf *data;
  char *__n;
  int argc_local;
  mmt_memory_dump *args_local;
  nvrm_ioctl_create *s_local;
  
  if ((s->cid != 0) || (iVar2 = _nvrm_field_enabled("cid"), iVar2 != 0)) {
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->handle != 0) || (iVar2 = _nvrm_field_enabled("handle"), iVar2 != 0)) {
    if ((s->handle != 0) || (iVar2 = _nvrm_field_enabled("handle"), iVar2 != 0)) {
      fprintf(_stdout,"%shandle: 0x%08x",nvrm_pfx,(ulong)s->handle);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
  }
  fprintf(_stdout,"%sclass: 0x%04x",nvrm_pfx,(ulong)s->cls);
  pcVar3 = nvrm_get_class_name(s->cls);
  if (pcVar3 != (char *)0x0) {
    fprintf(_stdout," [%s]",pcVar3);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->parent != 0) || (iVar2 = _nvrm_field_enabled("parent"), iVar2 != 0)) {
    if ((s->parent != 0) || (iVar2 = _nvrm_field_enabled("parent"), iVar2 != 0)) {
      fprintf(_stdout,"%sparent: 0x%08x",nvrm_pfx,(ulong)s->parent);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->parent,"parent");
  }
  local_38 = (mmt_buf *)0x0;
  if ((s->ptr != 0) || (iVar2 = _nvrm_field_enabled("ptr"), iVar2 != 0)) {
    if (s->ptr == 0) {
      fprintf(_stdout,"%sptr: %s",nvrm_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sptr: 0x%016lx",nvrm_pfx,s->ptr);
      if (0 < argc) {
        local_38 = find_ptr(s->ptr,args,argc);
      }
      if (local_38 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  nvrm_pfx = nvrm_sep;
  if ((s->status != 0) || (iVar2 = _nvrm_field_enabled("status"), iVar2 != 0)) {
    __stream = _stdout;
    pcVar3 = nvrm_pfx;
    pcVar4 = nvrm_status(s->status);
    fprintf(__stream,"%sstatus: %s",pcVar3,pcVar4);
  }
  nvrm_pfx = nvrm_sep;
  if (s->_pad != 0) {
    fprintf(_stdout,"%s%s_pad: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (local_38 != (mmt_buf *)0x0) {
    bVar1 = false;
    for (local_5c = 0; local_5c < nvrm_create_arg_decoder_cnt; local_5c = local_5c + 1) {
      lVar5 = (long)local_5c;
      if (nvrm_create_arg_decoders[lVar5].cls == s->cls) {
        if (nvrm_create_arg_decoders[lVar5].size == local_38->len) {
          nvrm_reset_pfx();
          if (indent_logs == 0) {
            fprintf(_stdout,"LOG:         %s","ptr[]: ");
          }
          else {
            fprintf(_stdout,"%64s        %s"," ","ptr[]: ");
          }
          if ((code *)nvrm_create_arg_decoders[lVar5].fun != (code *)0x0) {
            (*(code *)nvrm_create_arg_decoders[lVar5].fun)(s,local_38 + 1);
          }
          bVar1 = true;
        }
        break;
      }
    }
    if (!bVar1) {
      dump_mmt_buf_as_words_horiz(local_38,"ptr[]:");
    }
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create(struct nvrm_ioctl_create *s, struct mmt_memory_dump *args, int argc)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_class(s, cls);
	nvrm_print_handle(s, parent, cid);
	struct mmt_buf *data = nvrm_print_ptr(s, ptr, args, argc);
	nvrm_print_status(s, status);
	nvrm_print_pad_x32(s, _pad);
	nvrm_print_ln();

	if (data)
	{
		int found = 0;

		void (*fun)(struct nvrm_ioctl_create *, void *) = NULL;

		struct nvrm_create_arg_decoder *dec;
		int k;
		for (k = 0; k < nvrm_create_arg_decoder_cnt; ++k)
		{
			dec = &nvrm_create_arg_decoders[k];
			if (dec->cls == s->cls)
			{
				if (dec->size == data->len)
				{
					nvrm_reset_pfx();
					mmt_log("        %s", "ptr[]: ");
					fun = dec->fun;
					if (fun)
						fun(s, (void *)data->data);

					found = 1;
				}
				break;
			}
		}

		if (!found)
			dump_mmt_buf_as_words_horiz(data, "ptr[]:");
	}
}